

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_base.hpp
# Opt level: O2

void __thiscall
boost::
function2<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::assign_to_own(function2<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *this,function2<boost::iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *f)

{
  vtable_base *pvVar1;
  undefined8 uVar2;
  
  pvVar1 = (f->super_function_base).vtable;
  if (pvVar1 == (vtable_base *)0x0) {
    return;
  }
  (this->super_function_base).vtable = pvVar1;
  if (((ulong)pvVar1 & 1) == 0) {
    (*pvVar1->manager)(&(f->super_function_base).functor,&(this->super_function_base).functor,
                       clone_functor_tag);
    return;
  }
  (this->super_function_base).functor.bound_memfunc_ptr.obj_ptr =
       (f->super_function_base).functor.bound_memfunc_ptr.obj_ptr;
  uVar2 = *(undefined8 *)((long)&(f->super_function_base).functor + 8);
  (this->super_function_base).functor.obj_ptr = (f->super_function_base).functor.obj_ptr;
  *(undefined8 *)((long)&(this->super_function_base).functor + 8) = uVar2;
  return;
}

Assistant:

bool empty() const { return !vtable; }